

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O1

void __thiscall
itis::AVLTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
clear(AVLTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__args;
  pointer pcVar2;
  iterator __position;
  vector<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
  stack;
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_38;
  iterator iStack_30;
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_28;
  
  local_38 = (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              **)0x0;
  iStack_30._M_current =
       (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        **)0x0;
  local_28 = (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              **)0x0;
  if (this->root !=
      (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    std::
    vector<itis::AVLTreeNode<std::__cxx11::string>*,std::allocator<itis::AVLTreeNode<std::__cxx11::string>*>>
    ::_M_realloc_insert<itis::AVLTreeNode<std::__cxx11::string>*const&>
              ((vector<itis::AVLTreeNode<std::__cxx11::string>*,std::allocator<itis::AVLTreeNode<std::__cxx11::string>*>>
                *)&local_38,(iterator)0x0,&this->root);
  }
  if (local_38 != iStack_30._M_current) {
    do {
      __args = iStack_30._M_current[-1];
      __position._M_current = iStack_30._M_current + -1;
      if (__args->left !=
          (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0) {
        if (__position._M_current == local_28) {
          iStack_30._M_current = __position._M_current;
          std::
          vector<itis::AVLTreeNode<std::__cxx11::string>*,std::allocator<itis::AVLTreeNode<std::__cxx11::string>*>>
          ::_M_realloc_insert<itis::AVLTreeNode<std::__cxx11::string>*const&>
                    ((vector<itis::AVLTreeNode<std::__cxx11::string>*,std::allocator<itis::AVLTreeNode<std::__cxx11::string>*>>
                      *)&local_38,__position,&__args->left);
          __position._M_current = iStack_30._M_current;
        }
        else {
          *__position._M_current = __args->left;
          __position._M_current = iStack_30._M_current;
        }
      }
      iStack_30._M_current = __position._M_current;
      if (__args->right !=
          (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0) {
        if (iStack_30._M_current == local_28) {
          std::
          vector<itis::AVLTreeNode<std::__cxx11::string>*,std::allocator<itis::AVLTreeNode<std::__cxx11::string>*>>
          ::_M_realloc_insert<itis::AVLTreeNode<std::__cxx11::string>*const&>
                    ((vector<itis::AVLTreeNode<std::__cxx11::string>*,std::allocator<itis::AVLTreeNode<std::__cxx11::string>*>>
                      *)&local_38,iStack_30,&__args->right);
        }
        else {
          *iStack_30._M_current = __args->right;
          iStack_30._M_current = iStack_30._M_current + 1;
        }
      }
      this->_size = this->_size + -1;
      pcVar2 = (__args->value)._M_dataplus._M_p;
      paVar1 = &(__args->value).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
      }
      operator_delete(__args,0x38);
    } while (local_38 != iStack_30._M_current);
  }
  this->root = (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x0;
  if (local_38 !=
      (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       **)0x0) {
    operator_delete(local_38,(long)local_28 - (long)local_38);
  }
  return;
}

Assistant:

void AVLTree<T>::clear() {
    std::vector<AVLTreeNode<T> *> stack;

    if (root != nullptr) {
      stack.push_back(root);
    }

    while (!stack.empty()) {
      AVLTreeNode<T> *node = stack.back();
      stack.pop_back();

      if (node->left != nullptr) {
        stack.push_back(node->left);
      }

      if (node->right != nullptr) {
        stack.push_back(node->right);
      }

      _size--;
      delete node;
    }

    root = nullptr;
  }